

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

string * cmCTest::SafeBuildIdField(string *__return_storage_ptr__,string *value)

{
  ulong uVar1;
  long lVar2;
  char local_3a [2];
  size_t sStack_38;
  char replace [2];
  size_type n;
  size_type i;
  char *disallowed;
  string *value_local;
  string *safevalue;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) &&
     (lVar2 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x1102565),
     lVar2 != -1)) {
    sStack_38 = strlen("\\:*?\"<>|\n\r\t\f\v");
    local_3a[1] = 0;
    for (n = 0; n < sStack_38; n = n + 1) {
      local_3a[0] = "\\:*?\"<>|\n\r\t\f\v"[n];
      cmsys::SystemTools::ReplaceString(__return_storage_ptr__,local_3a,"");
    }
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"(empty)");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::SafeBuildIdField(const std::string& value)
{
  std::string safevalue(value);

  if (!safevalue.empty()) {
    // Disallow non-filename and non-space whitespace characters.
    // If they occur, replace them with ""
    //
    const char* disallowed = "\\:*?\"<>|\n\r\t\f\v";

    if (safevalue.find_first_of(disallowed) != std::string::npos) {
      std::string::size_type i = 0;
      std::string::size_type n = strlen(disallowed);
      char replace[2];
      replace[1] = 0;

      for (i = 0; i < n; ++i) {
        replace[0] = disallowed[i];
        cmSystemTools::ReplaceString(safevalue, replace, "");
      }
    }
  }

  if (safevalue.empty()) {
    safevalue = "(empty)";
  }

  return safevalue;
}